

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_migrate.c
# Opt level: O1

REF_STATUS ref_migrate_replicate_ghost(REF_GRID ref_grid)

{
  int iVar1;
  int iVar2;
  int iVar3;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  uint uVar4;
  REF_STATUS RVar5;
  void *pvVar6;
  long lVar7;
  undefined8 uVar8;
  REF_GRID pRVar9;
  long lVar10;
  int iVar11;
  REF_INT *local_00;
  REF_MPI pRVar12;
  long lVar13;
  REF_INT ncell;
  REF_INT local;
  REF_INT new_cell;
  REF_INT nodes [27];
  int local_e0;
  int local_dc;
  void *local_d8;
  long local_d0;
  REF_MPI local_c8;
  int local_bc;
  REF_GRID local_b8;
  REF_INT local_ac;
  REF_INT local_a8 [30];
  
  pRVar12 = ref_grid->mpi;
  ref_node = ref_grid->node;
  uVar4 = ref_node_synchronize_globals(ref_node);
  if (uVar4 == 0) {
    uVar4 = 0;
    if (1 < pRVar12->n) {
      local_c8 = pRVar12;
      local_b8 = ref_grid;
      if ((pRVar12->id != 0) && (0 < ref_node->old_n_global)) {
        lVar13 = 0;
        do {
          uVar4 = ref_node_add(ref_node,lVar13,&local_bc);
          if (uVar4 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                   ,0x706,"ref_migrate_replicate_ghost",(ulong)uVar4,"new_node");
            return uVar4;
          }
          ref_node->part[local_bc] = 0;
          lVar13 = lVar13 + 1;
        } while (lVar13 < ref_node->old_n_global);
      }
      uVar4 = ref_node_ghost_real(ref_node);
      pRVar9 = local_b8;
      if (uVar4 == 0) {
        uVar4 = ref_geom_ghost(local_b8->geom,ref_node);
        if (uVar4 == 0) {
          local_d0 = 0;
          pRVar12 = local_c8;
          do {
            ref_cell = pRVar9->cell[local_d0];
            if (pRVar12->id == 0) {
              local_e0 = ref_cell->n;
              uVar4 = ref_mpi_bcast(pRVar12,&local_e0,1,1);
              if (uVar4 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                       ,0x711,"ref_migrate_replicate_ghost",(ulong)uVar4,"bcast");
                return uVar4;
              }
              uVar4 = local_e0 * ref_cell->size_per;
              if ((int)uVar4 < 0) {
                uVar8 = 0x712;
                goto LAB_002255d8;
              }
              pvVar6 = malloc((ulong)uVar4 << 3);
              if (pvVar6 == (void *)0x0) {
                uVar8 = 0x712;
                goto LAB_0022560a;
              }
              local_e0 = 0;
              local_d8 = pvVar6;
              if (0 < ref_cell->max) {
                iVar11 = 0;
                do {
                  RVar5 = ref_cell_nodes(ref_cell,iVar11,local_a8);
                  if (RVar5 == 0) {
                    iVar1 = ref_cell->node_per;
                    lVar13 = (long)iVar1;
                    if (0 < lVar13) {
                      iVar2 = ref_cell->size_per;
                      lVar7 = 0;
                      do {
                        iVar3 = local_a8[lVar7];
                        lVar10 = -1;
                        if (((-1 < (long)iVar3) && (iVar3 < ref_node->max)) &&
                           (lVar10 = ref_node->global[iVar3], lVar10 < 0)) {
                          lVar10 = -1;
                        }
                        *(long *)((long)local_d8 + lVar7 * 8 + (long)(local_e0 * iVar2) * 8) =
                             lVar10;
                        lVar7 = lVar7 + 1;
                      } while (lVar13 != lVar7);
                    }
                    if (ref_cell->last_node_is_an_id != 0) {
                      *(long *)((long)local_d8 + (long)(local_e0 * ref_cell->size_per + iVar1) * 8)
                           = (long)local_a8[lVar13];
                    }
                    local_e0 = local_e0 + 1;
                  }
                  iVar11 = iVar11 + 1;
                } while (iVar11 < ref_cell->max);
              }
              pRVar12 = local_c8;
              if (local_e0 != ref_cell->n) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                       ,0x721,"ref_migrate_replicate_ghost","ncell miscount",(long)local_e0,
                       (long)ref_cell->n);
                return 1;
              }
              uVar4 = ref_mpi_bcast(local_c8,local_d8,ref_cell->size_per * local_e0,2);
              if (uVar4 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                       ,0x724,"ref_migrate_replicate_ghost",(ulong)uVar4,"bcast");
                return uVar4;
              }
            }
            else {
              uVar4 = ref_mpi_bcast(pRVar12,&local_e0,1,1);
              if (uVar4 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                       ,0x727,"ref_migrate_replicate_ghost",(ulong)uVar4,"bcast");
                return uVar4;
              }
              uVar4 = local_e0 * ref_cell->size_per;
              if ((int)uVar4 < 0) {
                uVar8 = 0x728;
LAB_002255d8:
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                       ,uVar8,"ref_migrate_replicate_ghost","malloc c2n of REF_GLOB negative");
                return 1;
              }
              pvVar6 = malloc((ulong)uVar4 << 3);
              if (pvVar6 == (void *)0x0) {
                uVar8 = 0x728;
LAB_0022560a:
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                       ,uVar8,"ref_migrate_replicate_ghost","malloc c2n of REF_GLOB NULL");
                return 2;
              }
              local_d8 = pvVar6;
              uVar4 = ref_mpi_bcast(pRVar12,pvVar6,uVar4,2);
              if (uVar4 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                       ,0x72b,"ref_migrate_replicate_ghost",(ulong)uVar4,"bcast");
                return uVar4;
              }
              if (0 < local_e0) {
                local_dc = 0;
                do {
                  local_00 = local_a8;
                  iVar11 = ref_cell->node_per;
                  if (0 < iVar11) {
                    lVar13 = 0;
                    do {
                      uVar4 = ref_node_local(ref_node,*(REF_GLOB *)
                                                       ((long)local_d8 +
                                                       ((long)local_dc * (long)ref_cell->size_per +
                                                       lVar13) * 8),local_00);
                      if (uVar4 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                               ,0x732,"ref_migrate_replicate_ghost",(ulong)uVar4,"g2l");
                        return uVar4;
                      }
                      lVar13 = lVar13 + 1;
                      iVar11 = ref_cell->node_per;
                      local_00 = local_00 + 1;
                      pRVar9 = local_b8;
                      pRVar12 = local_c8;
                    } while (lVar13 < iVar11);
                  }
                  if (ref_cell->last_node_is_an_id != 0) {
                    local_a8[iVar11] =
                         *(REF_INT *)
                          ((long)local_d8 + (long)(ref_cell->size_per * local_dc + iVar11) * 8);
                  }
                  uVar4 = ref_cell_add(ref_cell,local_a8,&local_ac);
                  if (uVar4 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                           ,0x739,"ref_migrate_replicate_ghost",(ulong)uVar4,"add cell");
                    return uVar4;
                  }
                  local_dc = local_dc + 1;
                } while (local_dc < local_e0);
              }
            }
            lVar13 = local_d0;
            free(local_d8);
            local_d0 = lVar13 + 1;
            uVar4 = 0;
          } while (local_d0 != 0x10);
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                 ,0x70c,"ref_migrate_replicate_ghost",(ulong)uVar4,"ghost geom");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
               0x70b,"ref_migrate_replicate_ghost",(ulong)uVar4,"ghost real");
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",0x700
           ,"ref_migrate_replicate_ghost",(ulong)uVar4,"sync global nodes");
  }
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_migrate_replicate_ghost(REF_GRID ref_grid) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GLOB global;
  REF_INT local;
  REF_INT group, ncell, cell, new_cell, cell_node, nodes[REF_CELL_MAX_SIZE_PER];
  REF_CELL ref_cell;
  REF_GLOB *c2n;

  RSS(ref_node_synchronize_globals(ref_node), "sync global nodes");

  if (!ref_mpi_para(ref_mpi)) return REF_SUCCESS;

  if (!ref_mpi_once(ref_mpi)) {
    for (global = 0; global < ref_node_n_global(ref_node); global++) {
      RSS(ref_node_add(ref_node, global, &local), "new_node");
      ref_node_part(ref_node, local) = 0;
    }
  }

  RSS(ref_node_ghost_real(ref_node), "ghost real");
  RSS(ref_geom_ghost(ref_grid_geom(ref_grid), ref_node), "ghost geom");

  each_ref_grid_all_ref_cell(ref_grid, group, ref_cell) {
    if (ref_mpi_once(ref_mpi)) {
      ncell = ref_cell_n(ref_cell);
      RSS(ref_mpi_bcast(ref_mpi, &ncell, 1, REF_INT_TYPE), "bcast");
      ref_malloc(c2n, ref_cell_size_per(ref_cell) * ncell, REF_GLOB);
      ncell = 0;
      each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
        for (cell_node = 0; cell_node < ref_cell_node_per(ref_cell);
             cell_node++) {
          c2n[cell_node + ref_cell_size_per(ref_cell) * ncell] =
              ref_node_global(ref_node, nodes[cell_node]);
        }
        if (ref_cell_last_node_is_an_id(ref_cell)) {
          c2n[ref_cell_id_index(ref_cell) +
              ref_cell_size_per(ref_cell) * ncell] =
              (REF_GLOB)nodes[ref_cell_id_index(ref_cell)];
        }
        ncell++;
      }
      REIS(ncell, ref_cell_n(ref_cell), "ncell miscount");
      RSS(ref_mpi_bcast(ref_mpi, c2n, ncell * ref_cell_size_per(ref_cell),
                        REF_GLOB_TYPE),
          "bcast");
      ref_free(c2n);
    } else {
      RSS(ref_mpi_bcast(ref_mpi, &ncell, 1, REF_INT_TYPE), "bcast");
      ref_malloc(c2n, ref_cell_size_per(ref_cell) * ncell, REF_GLOB);
      RSS(ref_mpi_bcast(ref_mpi, c2n, ncell * ref_cell_size_per(ref_cell),
                        REF_GLOB_TYPE),
          "bcast");
      for (cell = 0; cell < ncell; cell++) {
        for (cell_node = 0; cell_node < ref_cell_node_per(ref_cell);
             cell_node++) {
          RSS(ref_node_local(
                  ref_node, c2n[cell_node + cell * ref_cell_size_per(ref_cell)],
                  &(nodes[cell_node])),
              "g2l");
        }
        if (ref_cell_last_node_is_an_id(ref_cell)) {
          nodes[ref_cell_id_index(ref_cell)] =
              (REF_INT)c2n[ref_cell_id_index(ref_cell) +
                           ref_cell_size_per(ref_cell) * cell];
        }
        RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add cell");
      }
      ref_free(c2n);
    }
  }

  return REF_SUCCESS;
}